

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rational.h
# Opt level: O1

Rational * soplex::ratFromString(Rational *__return_storage_ptr__,char *desc)

{
  char cVar1;
  _Iter_comp_to_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_scipopt[P]soplex_src_soplex_rational_h:163:17),___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __pred;
  _Iter_comp_to_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_scipopt[P]soplex_src_soplex_rational_h:163:17),___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __pred_00;
  long lVar2;
  rational_type *prVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var7;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var8;
  int *piVar9;
  ulong uVar10;
  undefined8 uVar11;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  unaff_R12;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __last;
  bool bVar12;
  string den;
  string s;
  unkbyte10 in_stack_fffffffffffffef8;
  undefined6 in_stack_ffffffffffffff02;
  data_type local_f8;
  undefined4 local_e8;
  undefined1 uStack_e4;
  char cStack_e3;
  char cStack_e2;
  undefined1 uStack_e1;
  data_type local_d8;
  undefined4 local_c8;
  undefined2 local_c4;
  char local_c2;
  cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  *local_b8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b0;
  long local_a8;
  long local_a0 [2];
  cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  *local_90;
  double local_88;
  unsigned_long_long *local_80 [2];
  unsigned_long_long local_70 [2];
  char *local_60;
  char *local_58;
  long *local_50 [2];
  long local_40 [2];
  
  (__return_storage_ptr__->m_backend).m_value.num.m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_data.la[0] = 0;
  (__return_storage_ptr__->m_backend).m_value.num.m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_limbs = 1;
  prVar3 = &(__return_storage_ptr__->m_backend).m_value;
  (prVar3->num).m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_sign = false;
  (prVar3->num).m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_internal = true;
  (__return_storage_ptr__->m_backend).m_value.num.m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_alias = false;
  (__return_storage_ptr__->m_backend).m_value.den.m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_data.la[0] = 1;
  (__return_storage_ptr__->m_backend).m_value.den.m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_limbs = 1;
  prVar3 = &(__return_storage_ptr__->m_backend).m_value;
  (prVar3->den).m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_sign = false;
  (prVar3->den).m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_internal = true;
  (__return_storage_ptr__->m_backend).m_value.den.m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_alias = false;
  iVar4 = strcmp(desc,"inf");
  if (iVar4 == 0) {
    boost::multiprecision::backends::
    rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
    ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
                 *)__return_storage_ptr__,(longdouble)1e+100);
    return __return_storage_ptr__;
  }
  iVar4 = strcmp(desc,"-inf");
  if (iVar4 == 0) {
    boost::multiprecision::backends::
    rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
    ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
                 *)__return_storage_ptr__,(longdouble)-1e+100);
    return __return_storage_ptr__;
  }
  std::__cxx11::string::string((string *)&local_b0,desc,(allocator *)&local_f8.ld);
  local_90 = (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
              *)&(__return_storage_ptr__->m_backend).m_value.den;
  lVar6 = std::__cxx11::string::find_first_of((char *)&local_b0,0x35a45e,0);
  if (lVar6 == -1) {
    if (*local_b0._M_current == '+') {
      local_f8.la[0] = 0;
      local_e8 = 1;
      uStack_e4 = 0;
      cStack_e3 = '\x01';
      cStack_e2 = '\0';
      local_d8.la[0] = 1;
      local_c8 = 1;
      local_c4 = 0x100;
      local_c2 = '\0';
      boost::multiprecision::backends::
      rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
      ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                   *)&local_f8.ld,desc + 1);
    }
    else {
      local_f8.la[0] = 0;
      local_e8 = 1;
      uStack_e4 = 0;
      cStack_e3 = '\x01';
      cStack_e2 = '\0';
      local_d8.la[0] = 1;
      local_c8 = 1;
      local_c4 = 0x100;
      local_c2 = '\0';
      boost::multiprecision::backends::
      rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
      ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                   *)&local_f8.ld,desc);
    }
    boost::multiprecision::backends::
    cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    ::operator=((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                 *)__return_storage_ptr__,
                (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                 *)&local_f8.ld);
    boost::multiprecision::backends::
    cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    ::operator=(local_90,(cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                          *)&local_d8.ld);
    if ((local_c4._1_1_ == '\0') && (local_c2 == '\0')) {
      operator_delete(local_d8.ld.data,(local_d8.la[0] & 0xffffffff) << 3);
    }
    if ((cStack_e3 == '\0') && (cStack_e2 == '\0')) {
      operator_delete(local_f8.ld.data,(local_f8.la[0] & 0xffffffff) << 3);
    }
    goto LAB_001ab0c0;
  }
  local_f8.la[0] = (limb_type)&local_e8;
  local_b8 = (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
              *)__return_storage_ptr__;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"e","");
  uVar11 = local_f8.la[0];
  _Var7._M_current = local_b0._M_current;
  if (local_f8.ld.data != (unsigned_long_long *)0x0 && local_a8 != 0) {
    __last._M_current = local_b0._M_current + local_a8;
    if (local_f8.ld.data == (unsigned_long_long *)0x1) {
      __pred._M_it1._M_current._2_6_ = in_stack_ffffffffffffff02;
      __pred._0_10_ = in_stack_fffffffffffffef8;
      _Var7 = std::
              __find_if<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_comp_to_iter<soplex::findSubStringIC(std::__cxx11::string_const&,std::__cxx11::string_const&)::__0,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
                        (local_b0,__last,__pred);
    }
    else {
      local_88 = (double)(2 - local_f8._8_8_);
      __first._M_current = local_b0._M_current;
      do {
        __pred_00._M_it1._M_current._2_6_ = in_stack_ffffffffffffff02;
        __pred_00._0_10_ = in_stack_fffffffffffffef8;
        _Var8 = std::
                __find_if<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_comp_to_iter<soplex::findSubStringIC(std::__cxx11::string_const&,std::__cxx11::string_const&)::__0,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
                          (__first,__last,__pred_00);
        _Var7._M_current = __last._M_current;
        if (_Var8._M_current == __last._M_current) break;
        if (_Var8._M_current + 1 != __last._M_current) {
          lVar6 = 1;
          local_60 = _Var8._M_current + 1;
          local_58 = unaff_R12._M_current;
          do {
            cVar1 = *(char *)(uVar11 + lVar6);
            iVar4 = toupper((int)_Var8._M_current[lVar6]);
            iVar5 = toupper((int)cVar1);
            bVar12 = iVar4 != iVar5;
            __first._M_current = local_60;
            unaff_R12._M_current = local_58;
            if (bVar12) goto LAB_001aabc4;
            if ((long)local_88 + lVar6 == 1) {
              bVar12 = false;
              __first = _Var8;
              unaff_R12 = _Var8;
              goto LAB_001aabc4;
            }
            lVar2 = lVar6 + 1;
            lVar6 = lVar6 + 1;
          } while (_Var8._M_current + lVar2 != __last._M_current);
        }
        bVar12 = false;
        __first = _Var8;
        unaff_R12._M_current = __last._M_current;
LAB_001aabc4:
        _Var7._M_current = unaff_R12._M_current;
      } while (bVar12);
    }
  }
  if ((undefined4 *)uVar11 != &local_e8) {
    operator_delete((void *)uVar11,
                    CONCAT17(uStack_e1,
                             CONCAT16(cStack_e2,CONCAT15(cStack_e3,CONCAT14(uStack_e4,local_e8)))) +
                    1);
  }
  if (_Var7._M_current == local_b0._M_current + local_a8) {
    local_88 = 0.0;
    __return_storage_ptr__ = (Rational *)local_b8;
  }
  else {
    std::__cxx11::string::substr((ulong)&local_f8,(ulong)&local_b0);
    uVar11 = local_f8.la[0];
    piVar9 = __errno_location();
    iVar4 = *piVar9;
    *piVar9 = 0;
    lVar6 = strtol((char *)uVar11,(char **)local_80,10);
    if (local_80[0] == (unsigned_long_long *)uVar11) {
      std::__throw_invalid_argument("stoi");
LAB_001ab0fc:
      uVar11 = std::__throw_out_of_range("stoi");
      if (local_80[0] != local_70) {
        operator_delete(local_80[0],local_70[0] + 1);
      }
      if ((undefined4 *)local_f8.la[0] != &local_e8) {
        operator_delete((void *)local_f8.la[0],
                        CONCAT17(uStack_e1,
                                 CONCAT16(cStack_e2,CONCAT15(cStack_e3,CONCAT14(uStack_e4,local_e8))
                                         )) + 1);
      }
      if ((long *)local_b0._M_current != local_a0) {
        operator_delete(local_b0._M_current,local_a0[0] + 1);
      }
      boost::multiprecision::
      number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
      ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                 *)local_b8);
      _Unwind_Resume(uVar11);
    }
    if (((int)lVar6 != lVar6) || (*piVar9 == 0x22)) goto LAB_001ab0fc;
    if (*piVar9 == 0) {
      *piVar9 = iVar4;
    }
    if ((undefined4 *)local_f8.la[0] != &local_e8) {
      operator_delete((void *)local_f8.la[0],
                      CONCAT17(uStack_e1,
                               CONCAT16(cStack_e2,CONCAT15(cStack_e3,CONCAT14(uStack_e4,local_e8))))
                      + 1);
    }
    __return_storage_ptr__ = (Rational *)local_b8;
    std::__cxx11::string::substr((ulong)&local_f8,(ulong)&local_b0);
    std::__cxx11::string::operator=((string *)&local_b0,(string *)&local_f8.ld);
    if ((undefined4 *)local_f8.la[0] != &local_e8) {
      operator_delete((void *)local_f8.la[0],
                      CONCAT17(uStack_e1,
                               CONCAT16(cStack_e2,CONCAT15(cStack_e3,CONCAT14(uStack_e4,local_e8))))
                      + 1);
    }
    local_88 = (double)(int)lVar6;
  }
  if (*local_b0._M_current == '.') {
    std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,0x35b970);
  }
  uVar10 = std::__cxx11::string::find((char)&local_b0,0x2e);
  if (uVar10 != 0xffffffffffffffff) {
    lVar6 = ~uVar10 + local_a8;
    local_f8.la[0] = (limb_type)&local_e8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"1","");
    if (lVar6 != 0) {
      do {
        std::__cxx11::string::append((char *)local_f8.la);
        lVar6 = lVar6 + -1;
      } while (lVar6 != 0);
    }
    std::__cxx11::string::erase((ulong)&local_b0,uVar10);
    if (*local_b0._M_current == '-') {
      std::__cxx11::string::substr((ulong)local_80,(ulong)&local_b0);
      uVar10 = std::__cxx11::string::find_first_not_of((char)local_80,0x30);
      if (uVar10 < local_a8 - 1U) {
        std::__cxx11::string::substr((ulong)local_50,(ulong)&local_b0);
        std::__cxx11::string::find_first_not_of((char)local_50,0x30);
      }
      std::__cxx11::string::erase((ulong)&local_b0,1);
      if ((uVar10 < local_a8 - 1U) && (local_50[0] != local_40)) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      if (local_80[0] != local_70) {
        operator_delete(local_80[0],local_70[0] + 1);
      }
    }
    else {
      uVar10 = std::__cxx11::string::find_first_not_of((char)&local_b0,0x30);
      if (uVar10 < local_a8 - 1U) {
        std::__cxx11::string::find_first_not_of((char)&local_b0,0x30);
      }
      std::__cxx11::string::erase((ulong)&local_b0,0);
    }
    std::__cxx11::string::append((char *)&local_b0);
    std::__cxx11::string::_M_append((char *)&local_b0,local_f8.la[0]);
    if ((undefined4 *)local_f8.la[0] != &local_e8) {
      operator_delete((void *)local_f8.la[0],
                      CONCAT17(uStack_e1,
                               CONCAT16(cStack_e2,CONCAT15(cStack_e3,CONCAT14(uStack_e4,local_e8))))
                      + 1);
    }
  }
  if (*local_b0._M_current == '+') {
    std::__cxx11::string::substr((ulong)local_80,(ulong)&local_b0);
    local_f8.la[0] = 0;
    local_e8 = 1;
    uStack_e4 = 0;
    cStack_e3 = '\x01';
    cStack_e2 = '\0';
    local_d8.la[0] = 1;
    local_c8 = 1;
    local_c4 = 0x100;
    local_c2 = '\0';
    boost::multiprecision::backends::
    rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
    ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                 *)&local_f8.ld,(char *)local_80[0]);
    boost::multiprecision::backends::
    cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    ::operator=((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                 *)__return_storage_ptr__,
                (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                 *)&local_f8.ld);
    boost::multiprecision::backends::
    cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    ::operator=(local_90,(cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                          *)&local_d8.ld);
    if ((local_c4._1_1_ == '\0') && (local_c2 == '\0')) {
      operator_delete(local_d8.ld.data,(local_d8.la[0] & 0xffffffff) << 3);
    }
    if ((cStack_e3 == '\0') && (cStack_e2 == '\0')) {
      operator_delete(local_f8.ld.data,(local_f8.la[0] & 0xffffffff) << 3);
    }
    if (local_80[0] != local_70) {
      uVar10 = local_70[0] + 1;
LAB_001ab094:
      operator_delete(local_80[0],uVar10);
    }
  }
  else {
    local_f8.la[0] = 0;
    local_e8 = 1;
    uStack_e4 = 0;
    cStack_e3 = '\x01';
    cStack_e2 = '\0';
    local_d8.la[0] = 1;
    local_c8 = 1;
    local_c4 = 0x100;
    local_c2 = '\0';
    boost::multiprecision::backends::
    rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
    ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                 *)&local_f8.ld,local_b0._M_current);
    boost::multiprecision::backends::
    cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    ::operator=((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                 *)__return_storage_ptr__,
                (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                 *)&local_f8.ld);
    boost::multiprecision::backends::
    cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    ::operator=(local_90,(cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                          *)&local_d8.ld);
    if ((local_c4._1_1_ == '\0') && (local_c2 == '\0')) {
      operator_delete(local_d8.ld.data,(local_d8.la[0] & 0xffffffff) << 3);
    }
    if ((cStack_e3 == '\0') && (cStack_e2 == '\0')) {
      uVar10 = (local_f8.la[0] & 0xffffffff) << 3;
      local_80[0] = local_f8.ld.data;
      goto LAB_001ab094;
    }
  }
  local_f8.la[0] = (limb_type)pow(10.0,local_88);
  boost::multiprecision::
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
  ::operator*=((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
                *)__return_storage_ptr__,(double *)local_f8.la);
LAB_001ab0c0:
  if ((long *)local_b0._M_current != local_a0) {
    operator_delete(local_b0._M_current,local_a0[0] + 1);
  }
  return (Rational *)
         (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
          *)__return_storage_ptr__;
}

Assistant:

inline Rational ratFromString(const char* desc)
{
   Rational res;

   if(0 == strcmp(desc, "inf"))
   {
      res = 1e100;
   }
   else if(0 == strcmp(desc, "-inf"))
   {
      res = -1e100;
   }
   else
   {
      std::string s(desc);

      /* case 1: string is given in nom/den format */
      if(s.find_first_of(".Ee") == std::string::npos)
      {
         if(s[0] == '+')
            res = Rational(desc + 1);
         else
            res = Rational(desc);
      }
      /* case 2: string is given as base-10 decimal number */
      else
      {
         std::string::const_iterator it = findSubStringIC("e", s);
         int mult = 0;

         if(it != s.end())
         {
            int exponentidx = int(it - s.begin());
            mult = std::stoi(s.substr(exponentidx + 1, s.length()));
            s = s.substr(0, exponentidx);
         }

         // std::cout << s << std::endl;
         if(s[0] == '.')
            s.insert(0, "0");

         size_t pos = s.find('.');

         // if s contains a ., convert it to a rational
         if(pos != std::string::npos)
         {
            size_t exp = s.length() - 1 - pos;
            std::string den("1");

            for(size_t i = 0; i < exp; ++i)
               den.append("0");

            s.erase(pos, 1);
            assert(std::all_of(s.begin() + 1, s.end(), ::isdigit));

            // remove padding 0s
            if(s[0] == '-')
               s.erase(1, SOPLEX_MIN(s.substr(1).find_first_not_of('0'), s.size() - 1));
            else
               s.erase(0, SOPLEX_MIN(s.find_first_not_of('0'), s.size() - 1));

            s.append("/");
            s.append(den);
         }

         if(s[0] == '+')
            res = Rational(s.substr(1));
         else
            res = Rational(s);

         res *= pow(10, mult);
      }
   }

   return res;
}